

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

void getText(QString *text,QTextDocumentPrivate *priv,QString *docText,int pos,int end)

{
  QStringView v;
  QTextFragmentData *this;
  int *piVar1;
  int in_ECX;
  int in_R8D;
  long in_FS_OFFSET;
  int len;
  int offsetInFragment;
  QTextFragmentData *frag;
  FragmentIterator fragIt;
  QString *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int iVar2;
  int local_28;
  int local_24;
  int local_20 [2];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  while (in_ECX < in_R8D) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocumentPrivate::find
              ((QTextDocumentPrivate *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
               ,in_stack_ffffffffffffff94);
    in_stack_ffffffffffffff94 = in_ECX;
    this = QFragmentMap<QTextFragmentData>::ConstIterator::value((ConstIterator *)0x7a50bd);
    local_20[1] = 0;
    iVar2 = in_stack_ffffffffffffff94;
    local_20[0] = QFragmentMap<QTextFragmentData>::ConstIterator::position
                            ((ConstIterator *)0x7a50dc);
    local_20[0] = in_stack_ffffffffffffff94 - local_20[0];
    piVar1 = qMax<int>(local_20 + 1,local_20);
    in_stack_ffffffffffffff9c = *piVar1;
    local_24 = (this->super_QFragment<1>).size_array[0] - in_stack_ffffffffffffff9c;
    local_28 = in_R8D - iVar2;
    piVar1 = qMin<int>(&local_24,&local_28);
    in_stack_ffffffffffffff98 = *piVar1;
    QString::constData((QString *)0x7a5138);
    QStringView::QStringView<QChar,_true>
              ((QStringView *)this,
               (QChar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    v.m_data._0_4_ = in_R8D;
    v.m_size = (qsizetype)this;
    v.m_data._4_4_ = iVar2;
    QString::operator+=(in_stack_ffffffffffffff88,v);
    in_ECX = in_stack_ffffffffffffff98 + iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void getText(QString &text, QTextDocumentPrivate *priv, const QString &docText, int pos, int end)
{
    while (pos < end) {
        QTextDocumentPrivate::FragmentIterator fragIt = priv->find(pos);
        const QTextFragmentData * const frag = fragIt.value();

        const int offsetInFragment = qMax(0, pos - fragIt.position());
        const int len = qMin(int(frag->size_array[0] - offsetInFragment), end - pos);

        text += QStringView(docText.constData() + frag->stringPosition + offsetInFragment, len);
        pos += len;
    }
}